

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

pcut_item_t * pcut_get_real(pcut_item_t *item)

{
  pcut_item_t *item_local;
  
  if (item == (pcut_item_t *)0x0) {
    item_local = (pcut_item_t *)0x0;
  }
  else {
    item_local = item;
    if (item->kind == 0) {
      item_local = pcut_get_real_next(item);
    }
  }
  return item_local;
}

Assistant:

pcut_item_t *pcut_get_real(pcut_item_t *item) {
	if (item == NULL) {
		return NULL;
	}

	if (item->kind == PCUT_KIND_SKIP) {
		return pcut_get_real_next(item);
	} else {
		return item;
	}
}